

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O3

DiyFp __thiscall czh::utils::DiyFp::operator*(DiyFp *this,DiyFp *x)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  DiyFp DVar7;
  
  uVar1 = this->f & 0xffffffff;
  uVar2 = this->f >> 0x20;
  uVar6 = x->f & 0xffffffff;
  uVar4 = x->f >> 0x20;
  uVar5 = uVar4 * uVar1;
  uVar3 = uVar2 * uVar6;
  DVar7.f = ((uVar5 & 0xffffffff) + (uVar3 & 0xffffffff) + (uVar6 * uVar1 >> 0x20) + 0x80000000 >>
            0x20) + (uVar5 >> 0x20) + (uVar3 >> 0x20) + uVar4 * uVar2;
  DVar7.e = x->e + this->e + 0x40;
  DVar7._12_4_ = 0;
  return DVar7;
}

Assistant:

DiyFp operator*(const DiyFp &x) const
    {
      uint64_t a, b, c, d, ac, bc, ad, bd, tmp;
      uint64_t M32 = 0xFFFFFFFF;
      a = f >> 32;
      b = f & M32;
      c = x.f >> 32;
      d = x.f & M32;
      ac = a * c;
      bc = b * c;
      ad = a * d;
      bd = b * d;
      tmp = (bd >> 32) + (ad & M32) + (bc & M32);
      tmp += 1U << 31;
      return {ac + (ad >> 32) + (bc >> 32) + (tmp >> 32), e + x.e + 64};
    }